

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

deflate_allocs * alloc_deflate(zng_stream *strm,int windowBits,int lit_bufsize)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  uchar *puVar9;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  deflate_allocs *alloc_bufs;
  char *buff;
  char *original_buf;
  int total_size;
  int alloc_pos;
  int state_pos;
  int pending_pos;
  int head_pos;
  int prev_pos;
  int window_pos;
  int alloc_size;
  int state_size;
  int pending_size;
  int head_size;
  int prev_size;
  int window_size;
  int curr_size;
  deflate_allocs *local_8;
  
  uVar1 = (1 << (in_SIL & 0x1f)) * 2;
  iVar2 = (1 << (in_SIL & 0x1f)) * 2;
  iVar3 = uVar1 + (0x40 - (uVar1 & 0x3f) & 0x3f);
  uVar1 = iVar3 + iVar2;
  iVar4 = uVar1 + (0x40 - (uVar1 & 0x3f) & 0x3f);
  uVar1 = iVar4 + 0x20000;
  iVar5 = uVar1 + (0x40 - (uVar1 & 0x3f) & 0x3f);
  uVar1 = iVar5 + in_EDX * 5;
  iVar6 = uVar1 + (0x40 - (uVar1 & 0x3f) & 0x3f);
  uVar1 = iVar6 + 0x1800;
  iVar7 = uVar1 + (0x10 - (uVar1 & 0xf) & 0xf);
  pcVar8 = (char *)(**(code **)(in_RDI + 0x40))
                             (*(undefined8 *)(in_RDI + 0x50),1,
                              iVar7 + 0x77 + (0x40 - (iVar7 + 0x77U & 0x3f) & 0x3f));
  if (pcVar8 == (char *)0x0) {
    local_8 = (deflate_allocs *)0x0;
  }
  else {
    puVar9 = (uchar *)(pcVar8 + (0x40 - ((ulong)pcVar8 & 0x3f) & 0x3f));
    local_8 = (deflate_allocs *)(puVar9 + iVar7);
    local_8->buf_start = pcVar8;
    local_8->zfree = *(free_func *)(in_RDI + 0x48);
    local_8->window = puVar9;
    local_8->prev = (Pos *)(puVar9 + iVar3);
    local_8->head = (Pos *)(puVar9 + iVar4);
    local_8->pending_buf = puVar9 + iVar5;
    local_8->state = (deflate_state *)(puVar9 + iVar6);
    memset(local_8->prev,0,(long)iVar2);
  }
  return local_8;
}

Assistant:

Z_INTERNAL deflate_allocs* alloc_deflate(PREFIX3(stream) *strm, int windowBits, int lit_bufsize) {
    int curr_size = 0;

    /* Define sizes */
    int window_size = DEFLATE_ADJUST_WINDOW_SIZE((1 << windowBits) * 2);
    int prev_size = (1 << windowBits) * (int)sizeof(Pos);
    int head_size = HASH_SIZE * sizeof(Pos);
    int pending_size = lit_bufsize * LIT_BUFS;
    int state_size = sizeof(deflate_state);
    int alloc_size = sizeof(deflate_allocs);

    /* Calculate relative buffer positions and paddings */
    LOGSZP("window", window_size, PAD_WINDOW(curr_size), PADSZ(curr_size,WINDOW_PAD_SIZE));
    int window_pos = PAD_WINDOW(curr_size);
    curr_size = window_pos + window_size;

    LOGSZP("prev", prev_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int prev_pos = PAD_64(curr_size);
    curr_size = prev_pos + prev_size;

    LOGSZP("head", head_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int head_pos = PAD_64(curr_size);
    curr_size = head_pos + head_size;

    LOGSZP("pending", pending_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int pending_pos = PAD_64(curr_size);
    curr_size = pending_pos + pending_size;

    LOGSZP("state", state_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int state_pos = PAD_64(curr_size);
    curr_size = state_pos + state_size;

    LOGSZP("alloc", alloc_size, PAD_16(curr_size), PADSZ(curr_size,16));
    int alloc_pos = PAD_16(curr_size);
    curr_size = alloc_pos + alloc_size;

    /* Add 64-1 or 4096-1 to allow window alignment, and round size of buffer up to multiple of 64 */
    int total_size = PAD_64(curr_size + (WINDOW_PAD_SIZE - 1));

    /* Allocate buffer, align to 64-byte cacheline, and zerofill the resulting buffer */
    char *original_buf = (char *)strm->zalloc(strm->opaque, 1, total_size);
    if (original_buf == NULL)
        return NULL;

    char *buff = (char *)HINT_ALIGNED_WINDOW((char *)PAD_WINDOW(original_buf));
    LOGSZPL("Buffer alloc", total_size, PADSZ((uintptr_t)original_buf,WINDOW_PAD_SIZE), PADSZ(curr_size,WINDOW_PAD_SIZE));

    /* Initialize alloc_bufs */
    deflate_allocs *alloc_bufs  = (struct deflate_allocs_s *)(buff + alloc_pos);
    alloc_bufs->buf_start = original_buf;
    alloc_bufs->zfree = strm->zfree;

    /* Assign buffers */
    alloc_bufs->window = (unsigned char *)HINT_ALIGNED_WINDOW(buff + window_pos);
    alloc_bufs->prev = (Pos *)HINT_ALIGNED_64(buff + prev_pos);
    alloc_bufs->head = (Pos *)HINT_ALIGNED_64(buff + head_pos);
    alloc_bufs->pending_buf = (unsigned char *)HINT_ALIGNED_64(buff + pending_pos);
    alloc_bufs->state = (deflate_state *)HINT_ALIGNED_16(buff + state_pos);

    memset((char *)alloc_bufs->prev, 0, prev_size);

    return alloc_bufs;
}